

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_opcode_dsss(Context *ctx,char *opcode)

{
  size_t in_RCX;
  size_t in_RDX;
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  char local_138 [64];
  char local_f8 [64];
  char local_b8 [64];
  char local_78 [72];
  
  make_ARB1_destarg_string(ctx,local_78,in_RDX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_b8,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 1,local_f8,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 2,local_138,in_RCX);
  output_line(ctx,"%s%s, %s, %s, %s;",opcode,local_78,local_b8,local_f8,local_138);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void emit_ARB1_opcode_dsss(Context *ctx, const char *opcode)
{
    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_ARB1_srcarg_string(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_ARB1_srcarg_string(ctx, 2, src2, sizeof (src2));
    output_line(ctx, "%s%s, %s, %s, %s;", opcode, dst, src0, src1, src2);
    emit_ARB1_dest_modifiers(ctx);
}